

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O1

bool __thiscall
Memory::HeapPageAllocator<Memory::VirtualAllocWrapper>::IsAddressFromAllocator
          (HeapPageAllocator<Memory::VirtualAllocWrapper> *this,void *address)

{
  undefined4 *puVar1;
  char *pcVar2;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  PageSegmentBase<Memory::VirtualAllocWrapper> *pPVar6;
  SegmentBase<Memory::VirtualAllocWrapper> *pSVar7;
  undefined8 *in_FS_OFFSET;
  undefined1 local_78 [8];
  Iterator segmentsIterator;
  Iterator fullSegmentsIterator;
  Iterator largeSegmentsIterator;
  Iterator decommitSegmentsIterator;
  
  local_78 = (undefined1  [8])
             &(this->
              super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              ).segments;
  puVar1 = (undefined4 *)*in_FS_OFFSET;
  segmentsIterator.list =
       (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)local_78;
  while( true ) {
    if (segmentsIterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar4) goto LAB_0025824e;
      *puVar1 = 0;
    }
    segmentsIterator.list =
         ((segmentsIterator.list)->
         super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next.list;
    if ((undefined1  [8])segmentsIterator.list == local_78) break;
    pPVar6 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Iterator::
             Data((Iterator *)local_78);
    pcVar2 = (pPVar6->super_SegmentBase<Memory::VirtualAllocWrapper>).address;
    if (((pcVar2 <= address) &&
        (address < pcVar2 + ((pPVar6->super_SegmentBase<Memory::VirtualAllocWrapper>).
                             segmentPageCount -
                            (ulong)(pPVar6->super_SegmentBase<Memory::VirtualAllocWrapper>).
                                   secondaryAllocPageCount) * 0x1000)) &&
       (bVar4 = PageSegmentBase<Memory::VirtualAllocWrapper>::IsFreeOrDecommitted(pPVar6,address),
       !bVar4)) {
      return true;
    }
  }
  segmentsIterator.current =
       &(this->
        super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
        ).fullSegments.super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>;
  puVar1 = (undefined4 *)*in_FS_OFFSET;
  segmentsIterator.list =
       (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0;
  fullSegmentsIterator.list =
       (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
       segmentsIterator.current;
  while( true ) {
    if (fullSegmentsIterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar4) goto LAB_0025824e;
      *puVar1 = 0;
    }
    fullSegmentsIterator.list =
         ((fullSegmentsIterator.list)->
         super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next.list;
    if (fullSegmentsIterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
        segmentsIterator.current) break;
    pPVar6 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Iterator::
             Data((Iterator *)&segmentsIterator.current);
    pcVar2 = (pPVar6->super_SegmentBase<Memory::VirtualAllocWrapper>).address;
    if (((pcVar2 <= address) &&
        (address < pcVar2 + ((pPVar6->super_SegmentBase<Memory::VirtualAllocWrapper>).
                             segmentPageCount -
                            (ulong)(pPVar6->super_SegmentBase<Memory::VirtualAllocWrapper>).
                                   secondaryAllocPageCount) * 0x1000)) &&
       (bVar4 = PageSegmentBase<Memory::VirtualAllocWrapper>::IsFreeOrDecommitted(pPVar6,address),
       !bVar4)) {
      return true;
    }
  }
  fullSegmentsIterator.current =
       (NodeBase *)
       &(this->
        super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
        ).largeSegments;
  puVar1 = (undefined4 *)*in_FS_OFFSET;
  fullSegmentsIterator.list =
       (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0;
  largeSegmentsIterator.list =
       (DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
       fullSegmentsIterator.current;
  while( true ) {
    if (largeSegmentsIterator.list ==
        (DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar4) goto LAB_0025824e;
      *puVar1 = 0;
    }
    largeSegmentsIterator.list =
         ((largeSegmentsIterator.list)->
         super_DListNodeBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>_>).next.list;
    if (largeSegmentsIterator.list ==
        (DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
        fullSegmentsIterator.current) break;
    pSVar7 = DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Iterator::Data
                       ((Iterator *)&fullSegmentsIterator.current);
    if ((pSVar7->address <= address) &&
       (address < pSVar7->address +
                  (pSVar7->segmentPageCount - (ulong)pSVar7->secondaryAllocPageCount) * 0x1000)) {
      return true;
    }
  }
  largeSegmentsIterator.current =
       (NodeBase *)
       &(this->
        super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
        ).decommitSegments;
  puVar1 = (undefined4 *)*in_FS_OFFSET;
  largeSegmentsIterator.list =
       (DListBase<Memory::SegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0;
  decommitSegmentsIterator.list =
       (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
       largeSegmentsIterator.current;
  do {
    if (decommitSegmentsIterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar1 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/DList.h"
                         ,0x66,"(current != nullptr)","current != nullptr");
      if (!bVar4) {
LAB_0025824e:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar1 = 0;
    }
    decommitSegmentsIterator.list =
         ((decommitSegmentsIterator.list)->
         super_DListNodeBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>).next.list;
    bVar4 = decommitSegmentsIterator.list !=
            (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
            largeSegmentsIterator.current;
    if (decommitSegmentsIterator.list ==
        (DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *)
        largeSegmentsIterator.current) {
      return bVar4;
    }
    pPVar6 = DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::Iterator::
             Data((Iterator *)&largeSegmentsIterator.current);
    pcVar2 = (pPVar6->super_SegmentBase<Memory::VirtualAllocWrapper>).address;
    if (((pcVar2 <= address) &&
        (address < pcVar2 + ((pPVar6->super_SegmentBase<Memory::VirtualAllocWrapper>).
                             segmentPageCount -
                            (ulong)(pPVar6->super_SegmentBase<Memory::VirtualAllocWrapper>).
                                   secondaryAllocPageCount) * 0x1000)) &&
       (bVar5 = PageSegmentBase<Memory::VirtualAllocWrapper>::IsFreeOrDecommitted(pPVar6,address),
       !bVar5)) {
      return bVar4;
    }
  } while( true );
}

Assistant:

bool
HeapPageAllocator<T>::IsAddressFromAllocator(__in void* address)
{
    typename DListBase<PageSegmentBase<T>>::Iterator segmentsIterator(&this->segments);
    while (segmentsIterator.Next())
    {
        if (this->IsAddressInSegment(address, segmentsIterator.Data()))
        {
            return true;
        }
    }

    typename DListBase<PageSegmentBase<T>>::Iterator fullSegmentsIterator(&this->fullSegments);
    while (fullSegmentsIterator.Next())
    {
        if (this->IsAddressInSegment(address, fullSegmentsIterator.Data()))
        {
            return true;
        }
    }

    typename DListBase<SegmentBase<T>>::Iterator largeSegmentsIterator(&this->largeSegments);
    while (largeSegmentsIterator.Next())
    {
        if (this->IsAddressInSegment(address, largeSegmentsIterator.Data()))
        {
            return true;
        }
    }

    typename DListBase<PageSegmentBase<T>>::Iterator decommitSegmentsIterator(&this->decommitSegments);
    while (decommitSegmentsIterator.Next())
    {
        if (this->IsAddressInSegment(address, decommitSegmentsIterator.Data()))
        {
            return true;
        }
    }

    return false;
}